

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserFormatter.cpp
# Opt level: O3

void __thiscall
cali::UserFormatter::UserFormatter(UserFormatter *this,OutputStream *os,QuerySpec *spec)

{
  FormatImpl *this_00;
  const_iterator cVar1;
  ostream *poVar2;
  key_type local_48;
  
  (this->super_Formatter)._vptr_Formatter = (_func_int **)&PTR__UserFormatter_00277f40;
  this_00 = (FormatImpl *)operator_new(0x98);
  FormatImpl::FormatImpl(this_00,os);
  (this->mP).super___shared_ptr<cali::UserFormatter::FormatImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cali::UserFormatter::FormatImpl*>
            (&(this->mP).
              super___shared_ptr<cali::UserFormatter::FormatImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  FormatImpl::configure
            ((this->mP).
             super___shared_ptr<cali::UserFormatter::FormatImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             spec);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"title","");
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(spec->format).kwargs._M_t,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar1._M_node != &(spec->format).kwargs._M_t._M_impl.super__Rb_tree_header)
  {
    poVar2 = OutputStream::stream(os);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,*(char **)(cVar1._M_node + 2),(long)cVar1._M_node[2]._M_parent);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  return;
}

Assistant:

UserFormatter::UserFormatter(OutputStream& os, const QuerySpec& spec) : mP { new FormatImpl(os) }
{
    mP->configure(spec);

    {
        auto it = spec.format.kwargs.find("title");
        if (it != spec.format.kwargs.end()) {
            std::ostream* real_os = os.stream();
            *real_os << it->second << std::endl;
        }
    }
}